

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

EdgeOperation * __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::proposeMove
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v0,size_t v1)

{
  bool bVar1;
  bool bVar2;
  runtime_error *prVar3;
  size_t sVar4;
  size_t sVar5;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this_00;
  unsigned_long in_RCX;
  size_t in_RDX;
  long *in_RSI;
  EdgeOperation *in_RDI;
  double dVar6;
  value_type_conflict2 vVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pair<bool,_unsigned_long> pVar13;
  pair<bool,_unsigned_long> parentOfChild;
  size_t parent;
  size_t child;
  size_t partitionSize_1;
  pair<bool,_unsigned_long> *p2;
  unsigned_long *v2;
  pair<const_unsigned_long,_double> *other;
  const_iterator __end0;
  const_iterator __begin0;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *__range4;
  size_t partitionSize;
  pair<bool,_unsigned_long> *p1;
  pair<bool,_unsigned_long> *p0;
  value_type_conflict2 delta;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *in_stack_fffffffffffffe58;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffe80;
  unsigned_long _v1;
  size_t local_158;
  size_t local_100;
  unsigned_long local_c0;
  size_t local_b8;
  size_t local_b0;
  byte local_a8 [8];
  unsigned_long local_a0;
  byte *local_98;
  reference local_90;
  reference local_88;
  _Self local_80;
  _Self local_78;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *local_70;
  size_t local_68;
  byte local_60 [8];
  unsigned_long local_58;
  byte *local_50;
  byte local_48 [8];
  unsigned_long local_40;
  byte *local_38;
  value_type_conflict2 local_30;
  unsigned_long local_18;
  size_t local_10;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  bVar1 = edgeExists(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     (size_t)in_stack_fffffffffffffe70);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Cannot propose move for an edge that does not exist!")
    ;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_30 = getEdgeWeight(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,0x1bb35c);
  local_30 = -local_30;
  sVar4 = getFrameOfNode(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  sVar5 = getFrameOfNode(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  if (sVar4 == sVar5) {
    pVar13 = hasParent(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_40 = pVar13.second;
    local_48[0] = pVar13.first;
    local_38 = local_48;
    pVar13 = hasParent(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_58 = pVar13.second;
    local_60[0] = pVar13.first;
    local_50 = local_60;
    if ((*local_38 & 1) == (local_60[0] & 1)) {
      if ((((*local_38 & 1) != 0) ||
          (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) &&
         (((*local_38 & 1) == 0 ||
          ((((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0 ||
           (*(unsigned_long *)(local_38 + 8) != local_58)))))) {
        dVar6 = std::numeric_limits<double>::infinity();
        EdgeOperation::EdgeOperation(in_RDI,local_10,local_18,dVar6,0);
        return in_RDI;
      }
    }
    else {
      sVar4 = getFrameOfNode(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
      if (sVar4 != 0) {
        if ((*local_38 & 1) == 0) {
          local_100 = sizeOf(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
        }
        else {
          local_100 = sizeOf(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
        }
        local_68 = local_100;
        auVar9._8_4_ = (int)(local_100 >> 0x20);
        auVar9._0_8_ = local_100;
        auVar9._12_4_ = 0x45300000;
        local_30 = -*(double *)(*in_RSI + 0x10) *
                   ((auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_100) - 4503599627370496.0)) + local_30;
      }
    }
    local_70 = getAdjacentVertices(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
         ::begin(in_stack_fffffffffffffe58);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
         ::end(in_stack_fffffffffffffe58);
    while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
      local_90 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_double>_>::operator*
                           ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_double>_> *)
                            0x1bb653);
      local_88 = local_90;
      pVar13 = hasParent(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      local_a0 = pVar13.second;
      local_a8[0] = pVar13.first;
      local_98 = local_a8;
      bVar1 = edgeExists(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                         (size_t)in_stack_fffffffffffffe70);
      if (bVar1) {
        sVar4 = *(size_t *)(local_38 + 8);
        sVar5 = findRep(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
        if ((sVar4 == sVar5) &&
           (sVar4 = *(size_t *)(local_50 + 8),
           sVar5 = findRep(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58),
           sVar4 != sVar5)) {
          vVar7 = getEdgeWeight(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,0x1bb763
                               );
          local_30 = local_30 - vVar7;
        }
        else {
          sVar4 = *(size_t *)(local_50 + 8);
          sVar5 = findRep(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
          if ((sVar4 == sVar5) &&
             (sVar4 = *(size_t *)(local_38 + 8),
             sVar5 = findRep(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58),
             sVar4 != sVar5)) {
            vVar7 = getEdgeWeight(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,
                                  0x1bb813);
            local_30 = local_30 - vVar7;
          }
          else if ((*local_98 & 1) != 0) {
            sVar4 = *(size_t *)(local_98 + 8);
            sVar5 = findRep(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
            if (sVar4 == sVar5) {
              vVar7 = getEdgeWeight(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,
                                    0x1bb895);
              local_30 = local_30 - vVar7;
            }
            else {
              sVar4 = *(size_t *)(local_98 + 8);
              sVar5 = findRep(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
              if (sVar4 == sVar5) {
                vVar7 = getEdgeWeight(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,
                                      0x1bb903);
                local_30 = local_30 - vVar7;
              }
            }
          }
        }
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_double>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_double>_> *)
                 in_stack_fffffffffffffe60);
    }
    bVar1 = hasChild(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    bVar2 = hasChild(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    if (((bVar1 ^ 0xffU) & 1) == ((bVar2 ^ 0xffU) & 1)) {
      if ((*(byte *)(*in_RSI + 0x38) & 1) != 0) {
        sVar4 = children(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        sVar5 = children(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        if (2 < sVar4 + sVar5) {
          local_30 = std::numeric_limits<double>::infinity();
        }
      }
    }
    else {
      sVar4 = getFrameOfNode(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
      sVar5 = ProblemGraph::numberOfFrames(*(ProblemGraph **)*in_RSI);
      if (sVar4 != sVar5 - 1) {
        bVar1 = hasChild(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
        if (bVar1) {
          local_158 = sizeOf(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
        }
        else {
          local_158 = sizeOf(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
        }
        local_b0 = local_158;
        auVar10._8_4_ = (int)(local_158 >> 0x20);
        auVar10._0_8_ = local_158;
        auVar10._12_4_ = 0x45300000;
        local_30 = -*(double *)(*in_RSI + 8) *
                   ((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_158) - 4503599627370496.0)) + local_30;
      }
    }
    EdgeOperation::EdgeOperation(in_RDI,local_10,local_18,local_30,0);
  }
  else {
    local_b8 = local_10;
    local_c0 = local_18;
    sVar4 = getFrameOfNode(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    sVar5 = getFrameOfNode(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    if (sVar4 < sVar5) {
      std::swap<unsigned_long>(&local_b8,&local_c0);
    }
    if (((*(byte *)(*in_RSI + 0x38) & 1) == 0) ||
       (sVar4 = children(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68), sVar4 < 2)) {
      pVar13 = hasParent(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        sVar4 = getFrameOfNode(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
        if (sVar4 != 0) {
          dVar6 = *(double *)(*in_RSI + 0x10);
          sVar4 = sizeOf(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
          auVar11._8_4_ = (int)(sVar4 >> 0x20);
          auVar11._0_8_ = sVar4;
          auVar11._12_4_ = 0x45300000;
          local_30 = -dVar6 * ((auVar11._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) +
                     local_30;
        }
      }
      else {
        if (pVar13.second == local_c0) {
          sVar4 = local_b8;
          _v1 = local_c0;
          dVar6 = std::numeric_limits<double>::infinity();
          EdgeOperation::EdgeOperation(in_RDI,sVar4,_v1,dVar6,0);
          return in_RDI;
        }
        bVar1 = edgeExists(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                           (size_t)in_stack_fffffffffffffe70);
        if (!bVar1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Cannot have a parent with no connection!");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        vVar7 = getEdgeWeight(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,0x1bbd27);
        local_30 = vVar7 + local_30;
        sVar4 = children(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        if (sVar4 == 1) {
          sVar4 = sizeOf(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
          auVar8._8_4_ = (int)(sVar4 >> 0x20);
          auVar8._0_8_ = sVar4;
          auVar8._12_4_ = 0x45300000;
          local_30 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                     *(double *)(*in_RSI + 8) + local_30;
        }
      }
      bVar1 = hasChild(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
      if (!bVar1) {
        this_00 = (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)
                  getFrameOfNode(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
        sVar4 = ProblemGraph::numberOfFrames(*(ProblemGraph **)*in_RSI);
        if (this_00 != (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)(sVar4 - 1))
        {
          dVar6 = *(double *)(*in_RSI + 8);
          sVar4 = sizeOf(this_00,(size_t)dVar6);
          auVar12._8_4_ = (int)(sVar4 >> 0x20);
          auVar12._0_8_ = sVar4;
          auVar12._12_4_ = 0x45300000;
          local_30 = -dVar6 * ((auVar12._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) +
                     local_30;
        }
      }
      EdgeOperation::EdgeOperation(in_RDI,local_10,local_18,local_30,0);
    }
    else {
      dVar6 = std::numeric_limits<double>::infinity();
      EdgeOperation::EdgeOperation(in_RDI,local_10,local_18,dVar6,0);
    }
  }
  return in_RDI;
}

Assistant:

inline EdgeOperation proposeMove(const size_t v0, const size_t v1)
    {
        // increaseEdition(v0, v1); // invalidate old moves along (v0, v1)

        if (!edgeExists(v0, v1)) {
            throw std::runtime_error(
                "Cannot propose move for an edge that does not exist!");
        }

        // first part of cost change through merge / setParent.
        auto delta = -getEdgeWeight(v0, v1);

        // potential merge.
        if (getFrameOfNode(v0) == getFrameOfNode(v1)) {

            const auto& p0 = hasParent(v0);
            const auto& p1 = hasParent(v1);

            // Cases that can be merged:
            if (p0.first xor p1.first) { // one with parents.
                if (getFrameOfNode(v0) != 0) {
                    const size_t partitionSize =
                        p0.first ? sizeOf(v1) : sizeOf(v0);
                    delta -= data_.costBirth * partitionSize;
                }
            } else if (!p0.first && !p1.first) { // no parents.
                ;
            } else if (p0.first && p1.first &&
                       p0.second == p1.second) { // same parents.
                ;
            } else { // the rest cant.
                return {
                    v0, v1,
                    std::numeric_limits<typename EVA::value_type>::infinity(), 0
                };
            }

            // cost adjustments for all nodes that have either first
            // or second as a parent and share connections to the other.
            for (const auto& other : getAdjacentVertices(v1)) {
                const auto& v2 = other.first;
                const auto& p2 = hasParent(v2);

                if (edgeExists(v0, v2)) {
                    // is v2 a parent to v0 and not v1?
                    // (or vice versa)
                    if (p0.second == findRep(v2) and p1.second != findRep(v2)) {
                        delta -= getEdgeWeight(v1, v2);
                    } else if (p1.second == findRep(v2) and
                               p0.second != findRep(v2)) {
                        delta -= getEdgeWeight(v0, v2);
                    } else {

                        // is either v0 or v1 a parent of v2?
                        if (p2.first) {
                            if (p2.second ==
                                findRep(v0)) { // v0 is parent to v2
                                delta -= getEdgeWeight(v1, v2);
                            } else if (p2.second ==
                                       findRep(v1)) { // v1 is parent to v2
                                delta -= getEdgeWeight(v0, v2);
                            }
                        }
                    }
                }
            }

            // if one has no child, we gain a termination cost.
            if (!hasChild(v0) xor !hasChild(v1)) {
                if (getFrameOfNode(v0) !=
                    data_.problemGraph.numberOfFrames() - 1) {

                    const size_t partitionSize =
                        hasChild(v0) ? sizeOf(v1) : sizeOf(v0);
                    delta -= data_.costTermination * partitionSize;
                }
            } else if (this->data_.enforceBifurcationConstraint &&
                       children(v0) + children(v1) >= 3) {
                delta =
                    std::numeric_limits<typename EVA::value_type>::infinity();
            }

            return { v0, v1, delta, 0 };

            // Potential new parent.
        } else {
            size_t child = v0;
            size_t parent = v1;

            if (getFrameOfNode(child) < getFrameOfNode(parent)) {
                std::swap(child, parent);
            }

            // If bifurcation constraint is active:
            //    dont allow more than two children!
            if (this->data_.enforceBifurcationConstraint) {
                if (children(parent) >= 2) {
                    return { v0, v1, std::numeric_limits<
                                         typename EVA::value_type>::infinity(),
                             0 };
                }
            }

            // is it a re-set?
            {
                auto parentOfChild = hasParent(child);
                if (parentOfChild.first) {

                    if (parentOfChild.second == parent) {
                        return { child, parent,
                                 std::numeric_limits<
                                     typename EVA::value_type>::infinity(),
                                 0 };
                    } else {
                        if (!edgeExists(child, parentOfChild.second)) {
                            throw std::runtime_error(
                                "Cannot have a parent with no connection!");
                        }

                        delta += getEdgeWeight(child, parentOfChild.second);

                        // would the current parent form a terminal?
                        if (children(parentOfChild.second) == 1) {
                            delta += sizeOf(parentOfChild.second) *
                                     data_.costTermination;
                        }
                    }
                    // could we save birth costs?
                } else if (getFrameOfNode(child) != 0) {
                    delta -= data_.costBirth * sizeOf(child);
                }
            }

            if (!hasChild(parent) and
                getFrameOfNode(parent) !=
                    data_.problemGraph.numberOfFrames() - 1) {
                delta -= data_.costTermination * sizeOf(parent);
            }

            return { v0, v1, delta, 0 };
        }
    }